

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

ang_file * file_open(char *fname,file_mode mode,file_type ftype)

{
  int __fd;
  FILE *pFVar1;
  char *pcVar2;
  char local_428 [4];
  int fd;
  char buf [1024];
  ang_file *f;
  file_type ftype_local;
  file_mode mode_local;
  char *fname_local;
  
  buf._1016_8_ = mem_zalloc(0x18);
  path_parse(local_428,0x400,fname);
  if (mode == MODE_WRITE) {
    if (ftype == FTYPE_SAVE) {
      __fd = open(local_428,0xc1,0x180);
      if (__fd < 0) {
        *(undefined8 *)buf._1016_8_ = 0;
      }
      else {
        pFVar1 = fdopen(__fd,"wb");
        *(FILE **)buf._1016_8_ = pFVar1;
      }
    }
    else {
      pFVar1 = fopen(local_428,"wb");
      *(FILE **)buf._1016_8_ = pFVar1;
    }
  }
  else if (mode == MODE_READ) {
    pFVar1 = fopen(local_428,"rb");
    *(FILE **)buf._1016_8_ = pFVar1;
  }
  else {
    if (mode != MODE_APPEND) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-file.c"
                    ,0x40d,"ang_file *file_open(const char *, file_mode, file_type)");
    }
    pFVar1 = fopen(local_428,"a+");
    *(FILE **)buf._1016_8_ = pFVar1;
  }
  if (*(long *)buf._1016_8_ == 0) {
    mem_free((void *)buf._1016_8_);
    fname_local = (char *)0x0;
  }
  else {
    pcVar2 = string_make(local_428);
    *(char **)(buf._1016_8_ + 8) = pcVar2;
    *(file_mode *)(buf._1016_8_ + 0x10) = mode;
    if ((mode != MODE_READ) && (file_open_hook != (_func_void_char_ptr_file_type *)0x0)) {
      (*file_open_hook)(local_428,ftype);
    }
    fname_local = (char *)buf._1016_8_;
  }
  return (ang_file *)fname_local;
}

Assistant:

ang_file *file_open(const char *fname, file_mode mode, file_type ftype)
{
	ang_file *f = mem_zalloc(sizeof(ang_file));
	char buf[1024];

	(void)ftype;

	/* Get the system-specific path */
	path_parse(buf, sizeof(buf), fname);

	switch (mode) {
		case MODE_WRITE: { 
			if (ftype == FTYPE_SAVE) {
				/* open only if the file does not exist */
				int fd;
				fd = open(buf, O_CREAT | O_EXCL | O_WRONLY | O_BINARY, S_IRUSR | S_IWUSR);
				if (fd < 0) {
					/* there was some error */
					f->fh = NULL;
				} else {
					f->fh = fdopen(fd, "wb");
				}
			} else {
				f->fh = fopen(buf, "wb");
			}
			break;
		}
		case MODE_READ:
			f->fh = fopen(buf, "rb");
			break;
		case MODE_APPEND:
			f->fh = fopen(buf, "a+");
			break;
		default:
			assert(0);
	}

	if (f->fh == NULL) {
		mem_free(f);
		return NULL;
	}

	f->fname = string_make(buf);
	f->mode = mode;

	if (mode != MODE_READ && file_open_hook)
		file_open_hook(buf, ftype);

	return f;
}